

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

String * __thiscall
kj::stringifyStackTraceAddresses
          (String *__return_storage_ptr__,kj *this,ArrayPtr<void_*const> trace)

{
  kj *local_20;
  ArrayPtr<void_*const> trace_local;
  
  trace_local.ptr = trace.ptr;
  local_20 = this;
  trace_local.size_ = (size_t)__return_storage_ptr__;
  strArray<kj::ArrayPtr<void*const>&>
            (__return_storage_ptr__,(kj *)&local_20,(ArrayPtr<void_*const> *)0x26d581,
             (char *)trace.size_);
  return __return_storage_ptr__;
}

Assistant:

String stringifyStackTraceAddresses(ArrayPtr<void* const> trace) {
#if KJ_HAS_LIBDL
  return strArray(KJ_MAP(addr, trace) {
    Dl_info info;
    // Shared libraries are mapped near the end of the address space while the executable is mapped
    // near the beginning. We want to print addresses in the executable as raw addresses, not
    // offsets, since that's what addr2line expects for executables. For shared libraries it
    // expects offsets. In any case, most frames are likely to be in the main executable so it
    // makes the output cleaner if we don't repeatedly write its name.
    if (reinterpret_cast<uintptr_t>(addr) >= 0x400000000000ull && dladdr(addr, &info)) {
      uintptr_t offset = reinterpret_cast<uintptr_t>(addr) -
                         reinterpret_cast<uintptr_t>(info.dli_fbase);
      return kj::str(info.dli_fname, '@', reinterpret_cast<void*>(offset));
    } else {
      return kj::str(addr);
    }
  }, " ");
#else
  // TODO(someday): Support other platforms.
  return kj::strArray(trace, " ");
#endif
}